

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_sse4.c
# Opt level: O0

void horver_correlation_4x4
               (int16_t *diff,int stride,__m256i *xy_sum_32,__m256i *xz_sum_32,__m256i *x_sum_32,
               __m256i *x2_sum_32)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  int in_ESI;
  void *in_RDI;
  undefined1 (*in_R8) [32];
  undefined1 (*in_R9) [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m256i madd_slli;
  __m256i madd1_slli;
  __m256i madd_xz;
  __m256i perm;
  __m256i madd_xy;
  __m256i slli;
  __m256i pixels;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  uVar5 = loadu_int64(in_RDI);
  uVar6 = loadu_int64((void *)((long)in_RDI + (long)in_ESI * 2));
  uVar7 = loadu_int64((void *)((long)in_RDI + (long)(in_ESI * 2) * 2));
  uVar8 = loadu_int64((void *)((long)in_RDI + (long)(in_ESI * 3) * 2));
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar8;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar7;
  auVar9 = vpunpcklqdq_avx(auVar9,auVar11);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar6;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar5;
  auVar11 = vpunpcklqdq_avx(auVar10,auVar12);
  uStack_310 = auVar11._0_8_;
  uStack_308 = auVar11._8_8_;
  auVar1._16_8_ = uStack_310;
  auVar1._0_16_ = auVar9;
  auVar1._24_8_ = uStack_308;
  auVar2 = vpsllq_avx2(auVar1,ZEXT416(0x10));
  auVar4._16_8_ = uStack_310;
  auVar4._0_16_ = auVar9;
  auVar4._24_8_ = uStack_308;
  auVar1 = vpmaddwd_avx2(auVar4,auVar2);
  auVar1 = vpaddd_avx2(*in_RDX,auVar1);
  *in_RDX = auVar1;
  auVar1 = vpermq_avx2(auVar2,0x90);
  auVar1 = vpmaddwd_avx2(auVar2,auVar1);
  auVar1 = vpaddd_avx2(*in_RCX,auVar1);
  *in_RCX = auVar1;
  auVar9 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar9 = vpinsrw_avx(auVar9,1,2);
  auVar9 = vpinsrw_avx(auVar9,1,3);
  auVar9 = vpinsrw_avx(auVar9,1,4);
  auVar9 = vpinsrw_avx(auVar9,1,5);
  auVar9 = vpinsrw_avx(auVar9,1,6);
  auVar9 = vpinsrw_avx(auVar9,1,7);
  auVar11 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar11 = vpinsrw_avx(auVar11,1,2);
  auVar11 = vpinsrw_avx(auVar11,1,3);
  auVar11 = vpinsrw_avx(auVar11,1,4);
  auVar11 = vpinsrw_avx(auVar11,1,5);
  auVar11 = vpinsrw_avx(auVar11,1,6);
  auVar11 = vpinsrw_avx(auVar11,1,7);
  auVar10 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar9;
  uStack_70 = auVar10._0_8_;
  uStack_68 = auVar10._8_8_;
  auVar3._16_8_ = uStack_70;
  auVar3._0_16_ = ZEXT116(0) * auVar9 + ZEXT116(1) * auVar11;
  auVar3._24_8_ = uStack_68;
  auVar1 = vpmaddwd_avx2(auVar2,auVar3);
  auVar1 = vpaddd_avx2(*in_R8,auVar1);
  *in_R8 = auVar1;
  auVar1 = vpmaddwd_avx2(auVar2,auVar2);
  auVar1 = vpaddd_avx2(*in_R9,auVar1);
  *in_R9 = auVar1;
  return;
}

Assistant:

static inline void horver_correlation_4x4(const int16_t *diff, int stride,
                                          __m128i *xy_sum_32,
                                          __m128i *xz_sum_32, __m128i *x_sum_32,
                                          __m128i *x2_sum_32) {
  // Pixels in this 4x4   [ a b c d ]
  // are referred to as:  [ e f g h ]
  //                      [ i j k l ]
  //                      [ m n o p ]

  const __m128i pixelsa = xx_loadu_2x64(&diff[0 * stride], &diff[2 * stride]);
  const __m128i pixelsb = xx_loadu_2x64(&diff[1 * stride], &diff[3 * stride]);
  // pixelsa = [d c b a l k j i] as i16
  // pixelsb = [h g f e p o n m] as i16

  const __m128i slli_a = _mm_slli_epi64(pixelsa, 16);
  const __m128i slli_b = _mm_slli_epi64(pixelsb, 16);
  // slli_a = [c b a 0 k j i 0] as i16
  // slli_b = [g f e 0 o n m 0] as i16

  const __m128i xy_madd_a = _mm_madd_epi16(pixelsa, slli_a);
  const __m128i xy_madd_b = _mm_madd_epi16(pixelsb, slli_b);
  // xy_madd_a = [bc+cd ab jk+kl ij] as i32
  // xy_madd_b = [fg+gh ef no+op mn] as i32

  const __m128i xy32 = _mm_hadd_epi32(xy_madd_b, xy_madd_a);
  // xy32 = [ab+bc+cd ij+jk+kl ef+fg+gh mn+no+op] as i32
  *xy_sum_32 = _mm_add_epi32(*xy_sum_32, xy32);

  const __m128i xz_madd_a = _mm_madd_epi16(slli_a, slli_b);
  // xz_madd_a = [bf+cg ae jn+ko im] i32

  const __m128i swap_b = _mm_srli_si128(slli_b, 8);
  // swap_b = [0 0 0 0 g f e 0] as i16
  const __m128i xz_madd_b = _mm_madd_epi16(slli_a, swap_b);
  // xz_madd_b = [0 0 gk+fj ei] i32

  const __m128i xz32 = _mm_hadd_epi32(xz_madd_b, xz_madd_a);
  // xz32 = [ae+bf+cg im+jn+ko 0 ei+fj+gk] i32
  *xz_sum_32 = _mm_add_epi32(*xz_sum_32, xz32);

  // Now calculate the straight sums, x_sum += a+b+c+e+f+g+i+j+k
  // (sum up every element in slli_a and swap_b)
  const __m128i sum_slli_a = _mm_hadd_epi16(slli_a, slli_a);
  const __m128i sum_slli_a32 = _mm_cvtepi16_epi32(sum_slli_a);
  // sum_slli_a32 = [c+b a k+j i] as i32
  const __m128i swap_b32 = _mm_cvtepi16_epi32(swap_b);
  // swap_b32 = [g f e 0] as i32
  *x_sum_32 = _mm_add_epi32(*x_sum_32, sum_slli_a32);
  *x_sum_32 = _mm_add_epi32(*x_sum_32, swap_b32);
  // sum = [c+b+g a+f k+j+e i] as i32

  // Also sum their squares
  const __m128i slli_a_2 = _mm_madd_epi16(slli_a, slli_a);
  const __m128i swap_b_2 = _mm_madd_epi16(swap_b, swap_b);
  // slli_a_2 = [c2+b2 a2 k2+j2 i2]
  // swap_b_2 = [0 0 g2+f2 e2]
  const __m128i sum2 = _mm_hadd_epi32(slli_a_2, swap_b_2);
  // sum2 = [0 g2+f2+e2 c2+b2+a2 k2+j2+i2]
  *x2_sum_32 = _mm_add_epi32(*x2_sum_32, sum2);
}